

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ManGenCnf(word uTruth,int iLitOut,Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vClas,
                 Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Lit;
  int iVar5;
  byte bVar6;
  word uTruth_local;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  uTruth_local = uTruth;
  if (uTruth + 1 < 2) {
    Vec_IntPush(vClas,vLits->nSize);
    iVar1 = Abc_LitNotCond(iLitOut,(uint)(uTruth == 0));
    Vec_IntPush(vLits,iVar1);
    return;
  }
  if (vLeaves->nSize < 1) {
    __assert_fail("Vec_IntSize(vLeaves) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                  ,0x8a,
                  "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = 0;
  local_40 = vClas;
  local_38 = vLits;
  do {
    if (iVar1 == 2) {
      return;
    }
    iVar2 = Kit_TruthIsop((uint *)&uTruth_local,vLeaves->nSize,vCover,0);
    if (iVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                    ,0x8e,
                    "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (iVar2 = 0; iVar2 < vCover->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(vCover,iVar2);
      Vec_IntPush(vClas,vLits->nSize);
      iVar4 = Abc_LitNotCond(iLitOut,iVar1);
      Vec_IntPush(vLits,iVar4);
      bVar6 = 0;
      for (iVar4 = 0; iVar4 < vLeaves->nSize; iVar4 = iVar4 + 1) {
        switch(iVar3 >> (bVar6 & 0x1f) & 3) {
        case 0:
          goto switchD_005b3aec_caseD_0;
        case 1:
          iVar5 = 0;
          break;
        case 2:
          iVar5 = 1;
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                        ,0x9b,
                        "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        Lit = Vec_IntEntry(vLeaves,iVar4);
        iVar5 = Abc_LitNotCond(Lit,iVar5);
        vLits = local_38;
        Vec_IntPush(local_38,iVar5);
switchD_005b3aec_caseD_0:
        bVar6 = bVar6 + 2;
      }
      vClas = local_40;
    }
    uTruth_local = ~uTruth_local;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void Jf_ManGenCnf( word uTruth, int iLitOut, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vClas, Vec_Int_t * vCover )
{
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, (uTruth == 0)) );
    }
    else 
    {
        int i, k, c, Literal, Cube;
        assert( Vec_IntSize(vLeaves) > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, Vec_IntSize(vLeaves), vCover, 0 );
            assert( RetValue == 0 );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
                Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, c) );
                for ( k = 0; k < Vec_IntSize(vLeaves); k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
            }
            uTruth = ~uTruth;
        }
    }
}